

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

int GetKeyPressed(void)

{
  int iVar1;
  long lVar2;
  
  iVar1 = CORE.Input.Keyboard.keyPressedQueue[0];
  if (0 < CORE.Input.Keyboard.keyPressedQueueCount) {
    for (lVar2 = 0; lVar2 < CORE.Input.Keyboard.keyPressedQueueCount + -1; lVar2 = lVar2 + 1) {
      CORE.Input.Keyboard.keyPressedQueue[lVar2] = CORE.Input.Keyboard.keyPressedQueue[lVar2 + 1];
    }
    CORE.Input.Keyboard.keyPressedQueue[CORE.Input.Keyboard.keyPressedQueueCount + -1] = 0;
    CORE.Input.Keyboard.keyPressedQueueCount = CORE.Input.Keyboard.keyPressedQueueCount + -1;
    return iVar1;
  }
  return 0;
}

Assistant:

int GetKeyPressed(void)
{
    int value = 0;

    if (CORE.Input.Keyboard.keyPressedQueueCount > 0)
    {
        // Get character from the queue head
        value = CORE.Input.Keyboard.keyPressedQueue[0];

        // Shift elements 1 step toward the head
        for (int i = 0; i < (CORE.Input.Keyboard.keyPressedQueueCount - 1); i++)
            CORE.Input.Keyboard.keyPressedQueue[i] = CORE.Input.Keyboard.keyPressedQueue[i + 1];

        // Reset last character in the queue
        CORE.Input.Keyboard.keyPressedQueue[CORE.Input.Keyboard.keyPressedQueueCount - 1] = 0;
        CORE.Input.Keyboard.keyPressedQueueCount--;
    }

    return value;
}